

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int Display_Or_Erase_Field(FIELD *field,_Bool bEraseFlag)

{
  WINDOW_conflict *win_00;
  attr_t local_4c;
  WINDOW_conflict *local_40;
  WINDOW_conflict *local_38;
  WINDOW_conflict *fwin;
  WINDOW_conflict *win;
  _Bool bEraseFlag_local;
  FIELD *field_local;
  
  if (field == (FIELD *)0x0) {
    field_local._4_4_ = -1;
  }
  else {
    if (field->form->sub == (WINDOW_conflict *)0x0) {
      if (field->form->win == (WINDOW_conflict *)0x0) {
        local_40 = _stdscr;
      }
      else {
        local_40 = field->form->win;
      }
      local_38 = local_40;
    }
    else {
      local_38 = field->form->sub;
    }
    win_00 = (WINDOW_conflict *)
             derwin(local_38,(int)field->rows,(int)field->cols,(int)field->frow,(int)field->fcol);
    if (win_00 == (WINDOW_conflict *)0x0) {
      field_local._4_4_ = -1;
    }
    else {
      if ((field->opts & 1U) == 0) {
        if (local_38 == (WINDOW_conflict *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c = local_38->_attrs;
        }
        wattrset(win_00,local_4c);
      }
      else {
        wbkgdset(win_00,field->pad | field->back);
        wattrset(win_00,field->fore);
      }
      werase(win_00);
      if (!bEraseFlag) {
        if ((field->opts & 4U) != 0) {
          if ((((field->just == 0) || ((int)field->rows + field->nrow != 1)) ||
              (field->dcols != (int)field->cols)) || ((field->opts & 0x200U) == 0)) {
            Buffer_To_Window(field,win_00);
          }
          else {
            Perform_Justification(field,win_00);
          }
        }
        field->status = field->status & 0xfffd;
      }
      wsyncup(win_00);
      delwin(win_00);
      field_local._4_4_ = 0;
    }
  }
  return field_local._4_4_;
}

Assistant:

static int Display_Or_Erase_Field(FIELD * field, bool bEraseFlag)
{
  WINDOW *win;
  WINDOW *fwin;

  if (!field)
    return E_SYSTEM_ERROR;

  fwin = Get_Form_Window(field->form);
  win  = derwin(fwin,
                field->rows,field->cols,field->frow,field->fcol);

  if (!win) 
    return E_SYSTEM_ERROR;
  else
    {
      if (field->opts & O_VISIBLE)
        Set_Field_Window_Attributes(field,win);
      else
        {
#if defined(__LSB_VERSION__)
        /* getattrs() would be handy, but it is not part of LSB 4.0 */
        attr_t fwinAttrs;
        short  fwinPair;
        wattr_get(fwin, &fwinAttrs, &fwinPair, 0);
        wattr_set(win, fwinAttrs, fwinPair, 0);
#else
        wattrset(win,getattrs(fwin));
#endif
        }
      werase(win);
    }

  if (!bEraseFlag)
    {
      if (field->opts & O_PUBLIC)
        {
          if (Justification_Allowed(field))
            Perform_Justification(field,win);
          else
            Buffer_To_Window(field,win);
        }
      field->status &= ~_NEWTOP;
    }
  wsyncup(win);
  delwin(win);
  return E_OK;
}